

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::lazyPrintGroupInfo(ConsoleReporter *this)

{
  GroupInfo *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __rhs = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.
          super_Option<Catch::GroupInfo>.nullableValue;
  if (((__rhs->name)._M_string_length != 0) && (1 < __rhs->groupsCounts)) {
    std::operator+(&local_30,"Group: ",&__rhs->name);
    printClosedHeader(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    (this->super_StreamingReporterBase<Catch::ConsoleReporter>).currentGroupInfo.used = true;
  }
  return;
}

Assistant:

T* operator->() { return nullableValue; }